

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O1

void png_write_row(png_structrp png_ptr,png_const_bytep row)

{
  png_bytep ppVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *error_message;
  png_uint_32 pVar5;
  uint uVar6;
  png_row_info row_info;
  png_row_info local_28;
  
  if (png_ptr == (png_structrp)0x0) {
    return;
  }
  if ((png_ptr->row_number == 0) && (png_ptr->pass == '\0')) {
    if ((png_ptr->mode & 0x400) == 0) {
      error_message = "png_write_info was never called before png_write_row";
      goto LAB_0011f6d8;
    }
    png_write_start_row(png_ptr);
  }
  if ((png_ptr->interlaced != '\0') && ((png_ptr->transformations & 2) != 0)) {
    switch(png_ptr->pass) {
    case '\0':
      if ((png_ptr->row_number & 7) != 0) {
LAB_0011f5fe:
        png_write_finish_row(png_ptr);
        return;
      }
      break;
    case '\x01':
      if (((png_ptr->row_number & 7) != 0) || (png_ptr->width < 5)) goto LAB_0011f5fe;
      break;
    case '\x02':
      if ((png_ptr->row_number & 7) != 4) goto LAB_0011f5fe;
      break;
    case '\x03':
      if (((png_ptr->row_number & 3) != 0) || (png_ptr->width < 3)) goto LAB_0011f5fe;
      break;
    case '\x04':
      if ((png_ptr->row_number & 3) != 2) goto LAB_0011f5fe;
      break;
    case '\x05':
      if (((png_ptr->row_number & 1) != 0) || (png_ptr->width < 2)) goto LAB_0011f5fe;
      break;
    case '\x06':
      if ((png_ptr->row_number & 1) == 0) goto LAB_0011f5fe;
    }
  }
  local_28.color_type = png_ptr->color_type;
  local_28.width = png_ptr->usr_width;
  local_28.channels = png_ptr->usr_channels;
  local_28.bit_depth = png_ptr->usr_bit_depth;
  local_28.pixel_depth = local_28.bit_depth * local_28.channels;
  if (local_28.pixel_depth < 8) {
    local_28.rowbytes = (ulong)local_28.pixel_depth * (ulong)local_28.width + 7 >> 3;
  }
  else {
    local_28.rowbytes = (ulong)(local_28.pixel_depth >> 3) * (ulong)local_28.width;
  }
  memcpy(png_ptr->row_buf + 1,row,local_28.rowbytes);
  if ((((png_ptr->interlaced != '\0') && (png_ptr->pass < 6)) &&
      ((png_ptr->transformations & 2) != 0)) &&
     (png_do_write_interlace(&local_28,png_ptr->row_buf + 1,(uint)png_ptr->pass),
     local_28.width == 0)) {
    png_write_finish_row(png_ptr);
    return;
  }
  if (png_ptr->transformations != 0) {
    png_do_write_transformations(png_ptr,&local_28);
  }
  if ((local_28.pixel_depth != png_ptr->pixel_depth) ||
     (local_28.pixel_depth != png_ptr->transformed_pixel_depth)) {
    error_message = "internal write transform logic error";
LAB_0011f6d8:
    png_error(png_ptr,error_message);
  }
  if ((((png_ptr->mng_features_permitted & 4) != 0) && (png_ptr->filter_type == '@')) &&
     ((local_28.color_type & 2) != 0)) {
    if (local_28.bit_depth == '\x10') {
      if (local_28.color_type == 2) {
        lVar4 = 6;
      }
      else {
        if (local_28.color_type != 6) goto LAB_0011f685;
        lVar4 = 8;
      }
      if (local_28.width != 0) {
        ppVar1 = png_ptr->row_buf + 6;
        pVar5 = local_28.width;
        do {
          uVar6 = (uint)(ushort)(*(ushort *)(ppVar1 + -3) << 8 | *(ushort *)(ppVar1 + -3) >> 8);
          iVar3 = (ushort)(*(ushort *)(ppVar1 + -5) << 8 | *(ushort *)(ppVar1 + -5) >> 8) - uVar6;
          iVar2 = (ushort)(*(ushort *)(ppVar1 + -1) << 8 | *(ushort *)(ppVar1 + -1) >> 8) - uVar6;
          ppVar1[-5] = (png_byte)((uint)iVar3 >> 8);
          ppVar1[-4] = (png_byte)iVar3;
          ppVar1[-1] = (png_byte)((uint)iVar2 >> 8);
          *ppVar1 = (png_byte)iVar2;
          ppVar1 = ppVar1 + lVar4;
          pVar5 = pVar5 - 1;
        } while (pVar5 != 0);
      }
    }
    else if (local_28.bit_depth == '\b') {
      if (local_28.color_type == 2) {
        lVar4 = 3;
      }
      else {
        if (local_28.color_type != 6) goto LAB_0011f685;
        lVar4 = 4;
      }
      if (local_28.width != 0) {
        ppVar1 = png_ptr->row_buf + 3;
        pVar5 = local_28.width;
        do {
          ppVar1[-2] = ppVar1[-2] - ppVar1[-1];
          *ppVar1 = *ppVar1 - ppVar1[-1];
          ppVar1 = ppVar1 + lVar4;
          pVar5 = pVar5 - 1;
        } while (pVar5 != 0);
      }
    }
  }
LAB_0011f685:
  if ((local_28.color_type == 3) && (-1 < png_ptr->num_palette_max)) {
    png_do_check_palette_indexes(png_ptr,&local_28);
  }
  png_write_find_filter(png_ptr,&local_28);
  if (png_ptr->write_row_fn != (png_write_status_ptr)0x0) {
    (*png_ptr->write_row_fn)(png_ptr,png_ptr->row_number,(int)png_ptr->pass);
  }
  return;
}

Assistant:

void PNGAPI
png_write_row(png_structrp png_ptr, png_const_bytep row)
{
   /* 1.5.6: moved from png_struct to be a local structure: */
   png_row_info row_info;

   png_debug2(1, "in png_write_row (row %u, pass %d)",
       png_ptr->row_number, png_ptr->pass);

   if (png_ptr == NULL)
      return;

   /* Initialize transformations and other stuff if first time */
   if (png_ptr->row_number == 0 && png_ptr->pass == 0)
   {
      /* Make sure we wrote the header info */
      if ((png_ptr->mode & PNG_WROTE_INFO_BEFORE_PLTE) == 0)
         png_error(png_ptr,
             "png_write_info was never called before png_write_row");

      /* Check for transforms that have been set but were defined out */
#if !defined(PNG_WRITE_INVERT_SUPPORTED) && defined(PNG_READ_INVERT_SUPPORTED)
      if ((png_ptr->transformations & PNG_INVERT_MONO) != 0)
         png_warning(png_ptr, "PNG_WRITE_INVERT_SUPPORTED is not defined");
#endif

#if !defined(PNG_WRITE_FILLER_SUPPORTED) && defined(PNG_READ_FILLER_SUPPORTED)
      if ((png_ptr->transformations & PNG_FILLER) != 0)
         png_warning(png_ptr, "PNG_WRITE_FILLER_SUPPORTED is not defined");
#endif
#if !defined(PNG_WRITE_PACKSWAP_SUPPORTED) && \
    defined(PNG_READ_PACKSWAP_SUPPORTED)
      if ((png_ptr->transformations & PNG_PACKSWAP) != 0)
         png_warning(png_ptr,
             "PNG_WRITE_PACKSWAP_SUPPORTED is not defined");
#endif

#if !defined(PNG_WRITE_PACK_SUPPORTED) && defined(PNG_READ_PACK_SUPPORTED)
      if ((png_ptr->transformations & PNG_PACK) != 0)
         png_warning(png_ptr, "PNG_WRITE_PACK_SUPPORTED is not defined");
#endif

#if !defined(PNG_WRITE_SHIFT_SUPPORTED) && defined(PNG_READ_SHIFT_SUPPORTED)
      if ((png_ptr->transformations & PNG_SHIFT) != 0)
         png_warning(png_ptr, "PNG_WRITE_SHIFT_SUPPORTED is not defined");
#endif

#if !defined(PNG_WRITE_BGR_SUPPORTED) && defined(PNG_READ_BGR_SUPPORTED)
      if ((png_ptr->transformations & PNG_BGR) != 0)
         png_warning(png_ptr, "PNG_WRITE_BGR_SUPPORTED is not defined");
#endif

#if !defined(PNG_WRITE_SWAP_SUPPORTED) && defined(PNG_READ_SWAP_SUPPORTED)
      if ((png_ptr->transformations & PNG_SWAP_BYTES) != 0)
         png_warning(png_ptr, "PNG_WRITE_SWAP_SUPPORTED is not defined");
#endif

      png_write_start_row(png_ptr);
   }

#ifdef PNG_WRITE_INTERLACING_SUPPORTED
   /* If interlaced and not interested in row, return */
   if (png_ptr->interlaced != 0 &&
       (png_ptr->transformations & PNG_INTERLACE) != 0)
   {
      switch (png_ptr->pass)
      {
         case 0:
            if ((png_ptr->row_number & 0x07) != 0)
            {
               png_write_finish_row(png_ptr);
               return;
            }
            break;

         case 1:
            if ((png_ptr->row_number & 0x07) != 0 || png_ptr->width < 5)
            {
               png_write_finish_row(png_ptr);
               return;
            }
            break;

         case 2:
            if ((png_ptr->row_number & 0x07) != 4)
            {
               png_write_finish_row(png_ptr);
               return;
            }
            break;

         case 3:
            if ((png_ptr->row_number & 0x03) != 0 || png_ptr->width < 3)
            {
               png_write_finish_row(png_ptr);
               return;
            }
            break;

         case 4:
            if ((png_ptr->row_number & 0x03) != 2)
            {
               png_write_finish_row(png_ptr);
               return;
            }
            break;

         case 5:
            if ((png_ptr->row_number & 0x01) != 0 || png_ptr->width < 2)
            {
               png_write_finish_row(png_ptr);
               return;
            }
            break;

         case 6:
            if ((png_ptr->row_number & 0x01) == 0)
            {
               png_write_finish_row(png_ptr);
               return;
            }
            break;

         default: /* error: ignore it */
            break;
      }
   }
#endif

   /* Set up row info for transformations */
   row_info.color_type = png_ptr->color_type;
   row_info.width = png_ptr->usr_width;
   row_info.channels = png_ptr->usr_channels;
   row_info.bit_depth = png_ptr->usr_bit_depth;
   row_info.pixel_depth = (png_byte)(row_info.bit_depth * row_info.channels);
   row_info.rowbytes = PNG_ROWBYTES(row_info.pixel_depth, row_info.width);

   png_debug1(3, "row_info->color_type = %d", row_info.color_type);
   png_debug1(3, "row_info->width = %u", row_info.width);
   png_debug1(3, "row_info->channels = %d", row_info.channels);
   png_debug1(3, "row_info->bit_depth = %d", row_info.bit_depth);
   png_debug1(3, "row_info->pixel_depth = %d", row_info.pixel_depth);
   png_debug1(3, "row_info->rowbytes = %lu", (unsigned long)row_info.rowbytes);

   /* Copy user's row into buffer, leaving room for filter byte. */
   memcpy(png_ptr->row_buf + 1, row, row_info.rowbytes);

#ifdef PNG_WRITE_INTERLACING_SUPPORTED
   /* Handle interlacing */
   if (png_ptr->interlaced && png_ptr->pass < 6 &&
       (png_ptr->transformations & PNG_INTERLACE) != 0)
   {
      png_do_write_interlace(&row_info, png_ptr->row_buf + 1, png_ptr->pass);
      /* This should always get caught above, but still ... */
      if (row_info.width == 0)
      {
         png_write_finish_row(png_ptr);
         return;
      }
   }
#endif

#ifdef PNG_WRITE_TRANSFORMS_SUPPORTED
   /* Handle other transformations */
   if (png_ptr->transformations != 0)
      png_do_write_transformations(png_ptr, &row_info);
#endif

   /* At this point the row_info pixel depth must match the 'transformed' depth,
    * which is also the output depth.
    */
   if (row_info.pixel_depth != png_ptr->pixel_depth ||
       row_info.pixel_depth != png_ptr->transformed_pixel_depth)
      png_error(png_ptr, "internal write transform logic error");

#ifdef PNG_MNG_FEATURES_SUPPORTED
   /* Write filter_method 64 (intrapixel differencing) only if
    * 1. Libpng was compiled with PNG_MNG_FEATURES_SUPPORTED and
    * 2. Libpng did not write a PNG signature (this filter_method is only
    *    used in PNG datastreams that are embedded in MNG datastreams) and
    * 3. The application called png_permit_mng_features with a mask that
    *    included PNG_FLAG_MNG_FILTER_64 and
    * 4. The filter_method is 64 and
    * 5. The color_type is RGB or RGBA
    */
   if ((png_ptr->mng_features_permitted & PNG_FLAG_MNG_FILTER_64) != 0 &&
       (png_ptr->filter_type == PNG_INTRAPIXEL_DIFFERENCING))
   {
      /* Intrapixel differencing */
      png_do_write_intrapixel(&row_info, png_ptr->row_buf + 1);
   }
#endif

/* Added at libpng-1.5.10 */
#ifdef PNG_WRITE_CHECK_FOR_INVALID_INDEX_SUPPORTED
   /* Check for out-of-range palette index */
   if (row_info.color_type == PNG_COLOR_TYPE_PALETTE &&
       png_ptr->num_palette_max >= 0)
      png_do_check_palette_indexes(png_ptr, &row_info);
#endif

   /* Find a filter if necessary, filter the row and write it out. */
   png_write_find_filter(png_ptr, &row_info);

   if (png_ptr->write_row_fn != NULL)
      (*(png_ptr->write_row_fn))(png_ptr, png_ptr->row_number, png_ptr->pass);
}